

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_constructor_abi_cxx11_(CompilerGLSL *this,SPIRType *type)

{
  size_t sVar1;
  CompilerError *pCVar2;
  long in_RDX;
  uint local_a8;
  allocator local_a1;
  uint32_t i;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  long local_20;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *e;
  
  local_20 = in_RDX;
  type_local = type;
  this_local = this;
  if ((((ulong)type[0x19].super_IVariant._vptr_IVariant & 0x100000000) != 0) &&
     (sVar1 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x20)), 1 < sVar1
     )) {
    if ((type[0x16].image.ms & 1U) != 0) {
      local_55 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_40,
                 "Cannot flatten constructors of multidimensional array constructors, e.g. float[][]()."
                 ,&local_41);
      CompilerError::CompilerError(pCVar2,(string *)local_40);
      local_55 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((type[0x16].image.type.id & 1) == 0) &&
       (*(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char + 0x1c) <
        0x1ae)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"GL_ARB_arrays_of_arrays",&local_79);
      require_extension_internal((CompilerGLSL *)type,(string *)local_78);
      ::std::__cxx11::string::~string(local_78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else if (((type[0x16].image.type.id & 1) != 0) &&
            (*(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char + 0x1c) <
             0x136)) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&i,"Arrays of arrays not supported before ESSL version 310.",&local_a1);
      CompilerError::CompilerError(pCVar2,(string *)&i);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,local_20,0);
  if (((ulong)type[0x19].super_IVariant._vptr_IVariant & 0x100000000) != 0) {
    for (local_a8 = 0;
        sVar1 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(local_20 + 0x20)),
        local_a8 < sVar1; local_a8 = local_a8 + 1) {
      ::std::__cxx11::string::operator+=((string *)this,"[]");
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::type_to_glsl_constructor(const SPIRType &type)
{
	if (backend.use_array_constructor && type.array.size() > 1)
	{
		if (options.flatten_multidimensional_arrays)
			SPIRV_CROSS_THROW("Cannot flatten constructors of multidimensional array constructors, "
			                  "e.g. float[][]().");
		else if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_arrays_of_arrays");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310.");
	}

	auto e = type_to_glsl(type);
	if (backend.use_array_constructor)
	{
		for (uint32_t i = 0; i < type.array.size(); i++)
			e += "[]";
	}
	return e;
}